

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O1

void proto3_arena_unittest::TestUnpackedTypes::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  Nonnull<const_char_*> pcVar2;
  
  if (from_msg == to_msg) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 1),(RepeatedField<int> *)(from_msg + 1));
    google::protobuf::RepeatedField<long>::MergeFrom
              ((RepeatedField<long> *)(to_msg + 2),(RepeatedField<long> *)(from_msg + 2));
    google::protobuf::RepeatedField<unsigned_int>::MergeFrom
              ((RepeatedField<unsigned_int> *)(to_msg + 3),
               (RepeatedField<unsigned_int> *)(from_msg + 3));
    google::protobuf::RepeatedField<unsigned_long>::MergeFrom
              ((RepeatedField<unsigned_long> *)(to_msg + 4),
               (RepeatedField<unsigned_long> *)(from_msg + 4));
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 5),(RepeatedField<int> *)(from_msg + 5));
    google::protobuf::RepeatedField<long>::MergeFrom
              ((RepeatedField<long> *)(to_msg + 6),(RepeatedField<long> *)(from_msg + 6));
    google::protobuf::RepeatedField<unsigned_int>::MergeFrom
              ((RepeatedField<unsigned_int> *)(to_msg + 7),
               (RepeatedField<unsigned_int> *)(from_msg + 7));
    google::protobuf::RepeatedField<unsigned_long>::MergeFrom
              ((RepeatedField<unsigned_long> *)(to_msg + 8),
               (RepeatedField<unsigned_long> *)(from_msg + 8));
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 9),(RepeatedField<int> *)(from_msg + 9));
    google::protobuf::RepeatedField<long>::MergeFrom
              ((RepeatedField<long> *)(to_msg + 10),(RepeatedField<long> *)(from_msg + 10));
    google::protobuf::RepeatedField<float>::MergeFrom
              ((RepeatedField<float> *)(to_msg + 0xb),(RepeatedField<float> *)(from_msg + 0xb));
    google::protobuf::RepeatedField<double>::MergeFrom
              ((RepeatedField<double> *)(to_msg + 0xc),(RepeatedField<double> *)(from_msg + 0xc));
    google::protobuf::RepeatedField<bool>::MergeFrom
              ((RepeatedField<bool> *)(to_msg + 0xd),(RepeatedField<bool> *)(from_msg + 0xd));
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)(to_msg + 0xe),(RepeatedField<int> *)(from_msg + 0xe));
    uVar1 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar1 & 1) == 0) {
      return;
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
    return;
  }
  MergeImpl();
}

Assistant:

void TestUnpackedTypes::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestUnpackedTypes*>(&to_msg);
  auto& from = static_cast<const TestUnpackedTypes&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_arena_unittest.TestUnpackedTypes)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_uint32()->MergeFrom(from._internal_repeated_uint32());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_mutable_repeated_sint32()->MergeFrom(from._internal_repeated_sint32());
  _this->_internal_mutable_repeated_sint64()->MergeFrom(from._internal_repeated_sint64());
  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_sfixed32()->MergeFrom(from._internal_repeated_sfixed32());
  _this->_internal_mutable_repeated_sfixed64()->MergeFrom(from._internal_repeated_sfixed64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_double()->MergeFrom(from._internal_repeated_double());
  _this->_internal_mutable_repeated_bool()->MergeFrom(from._internal_repeated_bool());
  _this->_internal_mutable_repeated_nested_enum()->MergeFrom(from._internal_repeated_nested_enum());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}